

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

CK_RV __thiscall Token::loginUser(Token *this,ByteString *pin)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CK_RV CVar4;
  CK_ULONG flags;
  MutexLocker lock;
  ulong local_58;
  MutexLocker local_50;
  ByteString local_40;
  
  MutexLocker::MutexLocker(&local_50,this->tokenMutex);
  CVar4 = 5;
  if (this->sdm != (SecureDataManager *)0x0) {
    bVar1 = SecureDataManager::isSOLoggedIn(this->sdm);
    CVar4 = 0x104;
    if (!bVar1) {
      bVar1 = SecureDataManager::isUserLoggedIn(this->sdm);
      CVar4 = 0x100;
      if (!bVar1) {
        SecureDataManager::getUserPINBlob(&local_40,this->sdm);
        sVar3 = ByteString::size(&local_40);
        local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_40.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        if (sVar3 == 0) {
          CVar4 = 0x102;
        }
        else {
          iVar2 = (*this->token->_vptr_ObjectStoreToken[4])(this->token,&local_58);
          if ((char)iVar2 == '\0') {
            softHSMLog(3,"loginUser",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                       ,0xab,"Could not get the token flags");
            CVar4 = 5;
          }
          else {
            bVar1 = SecureDataManager::loginUser(this->sdm,pin);
            if (bVar1) {
              local_58 = local_58 & 0xfffffffffffeffff;
              (*this->token->_vptr_ObjectStoreToken[5])();
              CVar4 = 0;
            }
            else {
              local_58 = local_58 | 0x10000;
              CVar4 = 0xa0;
              (*this->token->_vptr_ObjectStoreToken[5])();
            }
          }
        }
      }
    }
  }
  MutexLocker::~MutexLocker(&local_50);
  return CVar4;
}

Assistant:

CK_RV Token::loginUser(ByteString& pin)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// SO cannot be logged in
	if (sdm->isSOLoggedIn()) return CKR_USER_ANOTHER_ALREADY_LOGGED_IN;

	// User cannot be logged in
	if (sdm->isUserLoggedIn()) return CKR_USER_ALREADY_LOGGED_IN;

	// The user PIN has to be initialized;
	if (sdm->getUserPINBlob().size() == 0) return CKR_USER_PIN_NOT_INITIALIZED;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Login
	if (!sdm->loginUser(pin))
	{
		flags |= CKF_USER_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		return CKR_PIN_INCORRECT;
	}

	flags &= ~CKF_USER_PIN_COUNT_LOW;
	token->setTokenFlags(flags);
	return CKR_OK;
}